

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

void __thiscall
pybind11::detail::error_fetch_and_normalize::error_fetch_and_normalize
          (error_fetch_and_normalize *this,char *called)

{
  PyTypeObject *pPVar1;
  char *__s;
  char *pcVar2;
  int iVar3;
  long *plVar4;
  PyTypeObject *pPVar5;
  size_type *psVar6;
  string msg;
  allocator<char> local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  object *local_38;
  
  local_38 = &this->m_value;
  local_40 = &(this->m_lazy_error_string).field_2;
  (this->m_type).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_value).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_trace).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_lazy_error_string)._M_dataplus._M_p = (pointer)local_40;
  (this->m_lazy_error_string)._M_string_length = 0;
  (this->m_lazy_error_string).field_2._M_local_buf[0] = '\0';
  this->m_lazy_error_string_completed = false;
  this->m_restore_called = false;
  PyErr_Fetch(this,local_38,&this->m_trace);
  pPVar1 = (PyTypeObject *)(this->m_type).super_handle.m_ptr;
  if (pPVar1 == (PyTypeObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,called,&local_a1);
    std::operator+(&local_80,"Internal error: ",&local_60);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar4[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
    }
    local_a0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pybind11_fail(&local_a0);
  }
  pPVar5 = *(PyTypeObject **)((long)&pPVar1->ob_base + 8);
  if (*(PyTypeObject **)((long)&pPVar1->ob_base + 8) == (PyTypeObject *)&PyType_Type) {
    pPVar5 = pPVar1;
  }
  __s = pPVar5->tp_name;
  if (__s == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,called,&local_a1);
    std::operator+(&local_80,"Internal error: ",&local_60);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar4[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
    }
    local_a0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pybind11_fail(&local_a0);
  }
  pcVar2 = (char *)(this->m_lazy_error_string)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->m_lazy_error_string,0,pcVar2,(ulong)__s);
  PyErr_NormalizeException(this,local_38,&this->m_trace);
  if ((this->m_type).super_handle.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,called,&local_a1);
    std::operator+(&local_80,"Internal error: ",&local_60);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)*plVar4;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
      local_a0.field_2._M_allocated_capacity = *psVar6;
      local_a0.field_2._8_8_ = plVar4[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar6;
    }
    local_a0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pybind11_fail(&local_a0);
  }
  iVar3 = std::__cxx11::string::compare((char *)&this->m_lazy_error_string);
  if (iVar3 == 0) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,called,(allocator<char> *)&local_60);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_a0._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar6) {
    local_a0.field_2._M_allocated_capacity = *psVar6;
    local_a0.field_2._8_8_ = plVar4[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar6;
  }
  local_a0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_a0);
  std::__cxx11::string::_M_append
            ((char *)&local_a0,(ulong)(this->m_lazy_error_string)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_a0);
  std::__cxx11::string::append((char *)&local_a0);
  format_value_and_trace_abi_cxx11_(&local_60,this);
  std::operator+(&local_80,": ",&local_60);
  std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  pybind11_fail(&local_a0);
}

Assistant:

explicit error_fetch_and_normalize(const char *called) {
        PyErr_Fetch(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
        if (!m_type) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " called while "
                            "Python error indicator not set.");
        }
        const char *exc_type_name_orig = detail::obj_class_name(m_type.ptr());
        if (exc_type_name_orig == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to obtain the name "
                            "of the original active exception type.");
        }
        m_lazy_error_string = exc_type_name_orig;
        // PyErr_NormalizeException() may change the exception type if there are cascading
        // failures. This can potentially be extremely confusing.
        PyErr_NormalizeException(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
        if (m_type.ptr() == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to normalize the "
                            "active exception.");
        }
        const char *exc_type_name_norm = detail::obj_class_name(m_type.ptr());
        if (exc_type_name_orig == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to obtain the name "
                            "of the normalized active exception type.");
        }
#if defined(PYPY_VERSION)
        // This behavior runs the risk of masking errors in the error handling, but avoids a
        // conflict with PyPy, which relies on the normalization here to change OSError to
        // FileNotFoundError (https://github.com/pybind/pybind11/issues/4075).
        m_lazy_error_string = exc_type_name_norm;
#else
        if (exc_type_name_norm != m_lazy_error_string) {
            std::string msg = std::string(called)
                              + ": MISMATCH of original and normalized "
                                "active exception types: ";
            msg += "ORIGINAL ";
            msg += m_lazy_error_string;
            msg += " REPLACED BY ";
            msg += exc_type_name_norm;
            msg += ": " + format_value_and_trace();
            pybind11_fail(msg);
        }
#endif
    }